

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

uint32_t asmjit::v1_14::CodeHolder_hashNameAndGetSize(char *name,size_t *nameSize)

{
  uint32_t uVar1;
  size_t i_1;
  size_t sVar2;
  
  if (*nameSize == 0xffffffffffffffff) {
    uVar1 = 0;
    for (sVar2 = 0; name[sVar2] != 0; sVar2 = sVar2 + 1) {
      uVar1 = uVar1 * 0x1003f + (uint)(byte)name[sVar2];
    }
    *nameSize = sVar2;
  }
  else {
    uVar1 = 0;
    for (sVar2 = 0; *nameSize != sVar2; sVar2 = sVar2 + 1) {
      if (name[sVar2] == 0) {
        return 0x11;
      }
      uVar1 = uVar1 * 0x1003f + (uint)(byte)name[sVar2];
    }
  }
  return uVar1;
}

Assistant:

static uint32_t CodeHolder_hashNameAndGetSize(const char* name, size_t& nameSize) noexcept {
  uint32_t hashCode = 0;
  if (nameSize == SIZE_MAX) {
    size_t i = 0;
    for (;;) {
      uint8_t c = uint8_t(name[i]);
      if (!c) break;
      hashCode = Support::hashRound(hashCode, c);
      i++;
    }
    nameSize = i;
  }
  else {
    for (size_t i = 0; i < nameSize; i++) {
      uint8_t c = uint8_t(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hashCode = Support::hashRound(hashCode, c);
    }
  }
  return hashCode;
}